

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

int __thiscall Liby::Connection::init(Connection *this,EVP_PKEY_CTX *ctx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined7 extraout_var;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_38._M_pod_data,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<Liby::Connection>);
  uVar2 = local_38._8_8_;
  uVar1 = local_38._M_unused._0_8_;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:20:19)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:20:19)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_()>::operator=
            (&((this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              readEventCallback_,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:21:19)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:21:19)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_()>::operator=
            (&((this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              writEventCallback_,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:22:19)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:22:19)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_()>::operator=
            (&((this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              erroEventCallback_,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    bVar3 = (*local_28)(&local_38,&local_38,__destroy_functor);
    local_28 = (code *)CONCAT71(extraout_var,bVar3);
  }
  return (int)local_28;
}

Assistant:

void Connection::init() {
    self_ = shared_from_this();
    chan_->onRead([this] { handleReadEvent(); });
    chan_->onWrit([this] { handleWritEvent(); });
    chan_->onErro([this] { handleErroEvent(); });
}